

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile_unix.cpp
# Opt level: O0

void __thiscall QLockFile::unlock(QLockFile *this)

{
  uint uVar1;
  QLockFilePrivate *__filename;
  long in_FS_OFFSET;
  QLockFilePrivate *d;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  QString *t;
  QMessageLogger *in_stack_ffffffffffffffa0;
  QDebug *this_00;
  QMessageLogger *in_stack_ffffffffffffffa8;
  QDebug *in_stack_ffffffffffffffb8;
  QDebug *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe8;
  QDebug local_10;
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __filename = d_func((QLockFile *)0x6acaa5);
  if ((__filename->isLocked & 1U) != 0) {
    close(__filename->fileHandle);
    __filename->fileHandle = -1;
    uVar1 = QFile::remove((char *)__filename);
    if ((uVar1 & 1) == 0) {
      t = (QString *)&stack0xffffffffffffffd0;
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffa0,(char *)t,line,in_stack_ffffffffffffff88);
      this_00 = &local_10;
      QMessageLogger::warning(in_stack_ffffffffffffffa8);
      QDebug::operator<<(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffe8);
      QDebug::operator<<(this_00,t);
      QDebug::operator<<(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffe8);
      QDebug::~QDebug(in_stack_ffffffffffffffd8);
    }
    __filename->lockError = NoError;
    __filename->isLocked = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLockFile::unlock()
{
    Q_D(QLockFile);
    if (!d->isLocked)
        return;
    close(d->fileHandle);
    d->fileHandle = -1;
    if (!QFile::remove(d->fileName)) {
        qWarning() << "Could not remove our own lock file" << d->fileName << "maybe permissions changed meanwhile?";
        // This is bad because other users of this lock file will now have to wait for the stale-lock-timeout...
    }
    d->lockError = QLockFile::NoError;
    d->isLocked = false;
}